

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.cpp
# Opt level: O2

void vera::image(TextureStream *_stream)

{
  Shader *pSVar1;
  DefaultShaders _type;
  DefaultShaders _type_00;
  allocator local_79;
  string local_78;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_58;
  undefined8 local_54;
  undefined8 uStack_4c;
  undefined4 local_44;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined4 local_30;
  undefined8 local_2c;
  undefined8 uStack_24;
  undefined4 local_1c;
  
  if (billboard_shader == (Shader *)0x0) {
    pSVar1 = (Shader *)operator_new(0x100);
    Shader::Shader(pSVar1);
    billboard_shader = pSVar1;
    getDefaultSrc_abi_cxx11_((string *)&local_58,(vera *)0x7,_type);
    getDefaultSrc_abi_cxx11_(&local_78,(vera *)0x6,_type_00);
    Shader::setSource(pSVar1,(string *)&local_58,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
  }
  Shader::use(billboard_shader);
  pSVar1 = billboard_shader;
  std::__cxx11::string::string((string *)&local_58,"u_depth",(allocator *)&local_78);
  Shader::setUniform(pSVar1,(string *)&local_58,0.0);
  std::__cxx11::string::~string((string *)&local_58);
  pSVar1 = billboard_shader;
  std::__cxx11::string::string((string *)&local_58,"u_scale",(allocator *)&local_78);
  Shader::setUniform(pSVar1,(string *)&local_58,1.0,1.0);
  std::__cxx11::string::~string((string *)&local_58);
  pSVar1 = billboard_shader;
  std::__cxx11::string::string((string *)&local_58,"u_translate",(allocator *)&local_78);
  Shader::setUniform(pSVar1,(string *)&local_58,0.0,0.0);
  std::__cxx11::string::~string((string *)&local_58);
  pSVar1 = billboard_shader;
  std::__cxx11::string::string((string *)&local_78,"u_modelViewProjectionMatrix",&local_79);
  local_58.x = 1.0;
  local_54 = 0;
  uStack_4c = 0;
  local_44 = 0x3f800000;
  local_40 = 0;
  uStack_38 = 0;
  local_30 = 0x3f800000;
  local_2c = 0;
  uStack_24 = 0;
  local_1c = 0x3f800000;
  Shader::setUniform(pSVar1,&local_78,(mat4 *)&local_58,false);
  std::__cxx11::string::~string((string *)&local_78);
  pSVar1 = billboard_shader;
  std::__cxx11::string::string((string *)&local_58,"u_tex0",(allocator *)&local_78);
  Shader::setUniformTexture(pSVar1,(string *)&local_58,&_stream->super_Texture,0);
  std::__cxx11::string::~string((string *)&local_58);
  Vbo::render(billboard_vbo,billboard_shader);
  return;
}

Assistant:

void image(const TextureStream *_stream) {
    if (billboard_shader == nullptr) {
        billboard_shader = new Shader();
        billboard_shader->setSource( getDefaultSrc(FRAG_DYNAMIC_BILLBOARD), getDefaultSrc(VERT_DYNAMIC_BILLBOARD) );
    }

    billboard_shader->use();
    billboard_shader->setUniform("u_depth", 0.0f);
    billboard_shader->setUniform("u_scale", 1.0f, 1.0f);
    billboard_shader->setUniform("u_translate", 0.0f, 0.0f);
    billboard_shader->setUniform("u_modelViewProjectionMatrix", glm::mat4(1.0) );
    billboard_shader->setUniformTexture("u_tex0", _stream, 0);
    billboard_vbo->render( billboard_shader );
}